

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

int fmt::v7::detail::format_float<double>
              (double value,int precision,float_specs specs,buffer<char> *buf)

{
  bool bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined8 divisor;
  int iVar10;
  result rVar11;
  ulong uVar12;
  size_t sVar13;
  byte bVar14;
  uint uVar15;
  long lVar16;
  uint64_t uVar17;
  size_t __len;
  uint64_t error;
  char cVar18;
  ulong uVar19;
  uint uVar20;
  uint uVar21;
  long lVar22;
  ulong uVar23;
  int iVar24;
  ulong uVar25;
  boundaries bVar26;
  fp local_88;
  ulong local_78;
  double local_70;
  undefined1 local_68 [8];
  fixed_handler handler;
  uint local_34 [2];
  int exp;
  
  if (value < 0.0) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/fmt/include/fmt/format-inl.h"
                ,0x435,"value is negative");
  }
  uVar25 = (ulong)specs & 0xff00000000;
  if (value <= 0.0) {
    if (0 < precision && uVar25 == 0x200000000) {
      uVar12 = (ulong)(uint)precision;
      uVar25 = buf->capacity_;
      if (uVar25 < uVar12) {
        (**buf->_vptr_buffer)(buf,uVar12);
        uVar25 = buf->capacity_;
      }
      if (uVar12 <= uVar25) {
        uVar25 = uVar12;
      }
      buf->size_ = uVar25;
      memset(buf->ptr_,0x30,uVar12);
      return -precision;
    }
    sVar13 = buf->size_;
    uVar25 = sVar13 + 1;
    if (buf->capacity_ < uVar25) {
      (**buf->_vptr_buffer)(buf);
      sVar13 = buf->size_;
      uVar25 = sVar13 + 1;
    }
    buf->size_ = uVar25;
    buf->ptr_[sVar13] = '0';
    return 0;
  }
  if ((specs._4_4_ >> 0x13 & 1) == 0) {
    iVar10 = snprintf_float<double>(value,precision,specs,buf);
    return iVar10;
  }
  local_34[0] = 0;
  if (precision < 0) {
    local_88.f = 0;
    local_88.e = 0;
    if ((specs._4_4_ >> 0x12 & 1) == 0) {
      local_70 = value;
      bVar26 = fp::assign_with_boundaries<double>(&local_88,value);
    }
    else {
      local_70 = value;
      bVar26 = fp::assign_float_with_boundaries<double>(&local_88,value);
    }
    if ((local_88.f >> 0x34 & 1) == 0) {
      lVar16 = 0x3f;
      if ((local_88.f & 0xfffffffffffff) != 0) {
        for (; (local_88.f & 0xfffffffffffff) >> lVar16 == 0; lVar16 = lVar16 + -1) {
        }
      }
      local_88.f = local_88.f << (~(byte)lVar16 + 0x35 & 0x3f);
      local_88.e = (local_88.e - ((uint)lVar16 ^ 0x3f)) + 0xb;
    }
    iVar10 = (int)((ulong)((long)(-0x32 - local_88.e) * 0x4d104d42 + 0xffffffff) >> 0x20);
    uVar15 = iVar10 + 0x15b;
    uVar20 = iVar10 + 0x162;
    if (-1 < (int)uVar15) {
      uVar20 = uVar15;
    }
    uVar25 = *(ulong *)(basic_data<void>::pow10_significands + (long)((int)uVar20 >> 3) * 8 + 8);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar25;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = local_88.f << 0xb;
    local_88.f = SUB168(auVar2 * auVar6,8) - (SUB168(auVar2 * auVar6,0) >> 0x3f);
    iVar10 = local_88.e +
             *(short *)(basic_data<void>::pow10_exponents + (long)((int)uVar20 >> 3) * 2 + 2) + 0x35
    ;
    if (0x1c < local_88.e +
               *(short *)(basic_data<void>::pow10_exponents + (long)((int)uVar20 >> 3) * 2 + 2) +
               0x71U) {
      local_88.e = iVar10;
      __assert_fail("min_exp <= fp_value.e && fp_value.e <= -32",
                    "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/fmt/include/fmt/format-inl.h"
                    ,0x455,
                    "int fmt::detail::format_float(T, int, float_specs, buffer<char> &) [T = double]"
                   );
    }
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar25;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = bVar26.upper;
    lVar16 = SUB168(auVar3 * auVar7,8);
    lVar22 = -(SUB168(auVar3 * auVar7,0) >> 0x3f);
    uVar23 = lVar16 + lVar22 + 1;
    local_68 = (undefined1  [8])buf->ptr_;
    handler._8_8_ = uVar23 - local_88.f;
    bVar14 = -(char)iVar10;
    handler._16_8_ = 1L << (bVar14 & 0x3f);
    uVar12 = uVar23 >> (bVar14 & 0x3f);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar25;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = bVar26.lower;
    handler.buf._0_4_ = 0;
    uVar15 = (uint)uVar12;
    local_88.e = iVar10;
    if (uVar15 == 0) {
LAB_00231022:
      handler.buf._0_4_ = 0;
      assert_fail("/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/fmt/include/fmt/format-inl.h"
                  ,0x334,"");
    }
    local_78 = handler._16_8_ - 1;
    local_34[0] = 1;
    if (((((9 < uVar15) && (local_34[0] = 2, 99 < uVar15)) && (local_34[0] = 3, 999 < uVar15)) &&
        ((local_34[0] = 4, 9999 < uVar15 && (local_34[0] = 5, 99999 < uVar15)))) &&
       ((local_34[0] = 6, 999999 < uVar15 &&
        ((local_34[0] = 7, 9999999 < uVar15 && (local_34[0] = 8, 99999999 < uVar15)))))) {
      local_34[0] = 10 - (uVar15 < 1000000000);
    }
    iVar24 = (uVar20 & 0xfffffff8) + 8;
    uVar17 = ((SUB168(auVar4 * auVar8,0) >> 0x3f) - SUB168(auVar4 * auVar8,8)) + lVar16 + lVar22 + 2
    ;
    uVar23 = uVar23 & local_78;
    do {
      uVar20 = local_34[0] - 1;
      switch((ulong)uVar20) {
      case 0:
        cVar18 = (char)uVar12;
        uVar12 = 0;
        goto LAB_00230abf;
      case 1:
        cVar18 = (char)((uVar12 & 0xffffffff) / 10);
        iVar10 = (int)((uVar12 & 0xffffffff) / 10) * 10;
        break;
      case 2:
        cVar18 = (char)((uVar12 & 0xffffffff) / 100);
        iVar10 = (int)((uVar12 & 0xffffffff) / 100) * 100;
        break;
      case 3:
        cVar18 = (char)((uVar12 & 0xffffffff) / 1000);
        iVar10 = (int)((uVar12 & 0xffffffff) / 1000) * 1000;
        break;
      case 4:
        cVar18 = (char)((uVar12 & 0xffffffff) / 10000);
        iVar10 = (int)((uVar12 & 0xffffffff) / 10000) * 10000;
        break;
      case 5:
        uVar25 = uVar12 >> 5 & 0x7ffffff;
        cVar18 = (char)(uVar25 / 0xc35);
        iVar10 = (int)(uVar25 / 0xc35) * 100000;
        break;
      case 6:
        cVar18 = (char)((uVar12 & 0xffffffff) / 1000000);
        iVar10 = (int)((uVar12 & 0xffffffff) / 1000000) * 1000000;
        break;
      case 7:
        cVar18 = (char)((uVar12 & 0xffffffff) / 10000000);
        iVar10 = (int)((uVar12 & 0xffffffff) / 10000000) * 10000000;
        break;
      case 8:
        cVar18 = (char)((uVar12 & 0xffffffff) / 100000000);
        iVar10 = (int)((uVar12 & 0xffffffff) / 100000000) * 100000000;
        break;
      case 9:
        uVar25 = (uVar12 >> 9 & 0x7fffff) * 0x44b83;
        cVar18 = (char)(uVar25 >> 0x27);
        iVar10 = (uint)(uVar25 >> 0x27) * 1000000000;
        break;
      default:
        goto switchD_00230d96_default;
      }
      uVar12 = (ulong)(uint)((int)uVar12 - iVar10);
LAB_00230abf:
      local_34[0] = uVar20;
      rVar11 = grisu_shortest_handler::on_digit
                         ((grisu_shortest_handler *)local_68,cVar18 + '0',
                          (&basic_data<void>::powers_of_10_64)[uVar20] << (bVar14 & 0x3f),
                          (uVar12 << (bVar14 & 0x3f)) + uVar23,uVar17,uVar20,true);
      divisor = handler._16_8_;
      uVar25 = local_78;
      if (rVar11 != more) goto LAB_00230b5e;
    } while (0 < (int)local_34[0]);
    do {
      uVar12 = uVar23 * 10;
      uVar17 = uVar17 * 10;
      uVar23 = uVar12 & uVar25;
      local_34[0] = local_34[0] - 1;
      rVar11 = grisu_shortest_handler::on_digit
                         ((grisu_shortest_handler *)local_68,(char)(uVar12 >> (bVar14 & 0x3f)) + '0'
                          ,divisor,uVar23,uVar17,local_34[0],false);
    } while (rVar11 == more);
LAB_00230b5e:
    uVar25 = (ulong)(uint)handler.buf;
    if (rVar11 == error) {
      local_34[0] = local_34[0] + ((uint)handler.buf - iVar24) + 0x15b;
      fallback_format<double>(local_70,buf,(int *)local_34);
      return local_34[0];
    }
    if ((int)(uint)handler.buf < 0) {
LAB_00230f62:
      assert_fail("/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/fmt/include/fmt/core.h"
                  ,0x13c,"negative value");
    }
    uVar12 = buf->capacity_;
    if (uVar12 < uVar25) {
      (**buf->_vptr_buffer)(buf,uVar25);
      uVar12 = buf->capacity_;
    }
    if (uVar12 < uVar25) {
      uVar25 = uVar12;
    }
    buf->size_ = uVar25;
LAB_00230fd2:
    iVar10 = (local_34[0] - iVar24) + 0x15c;
  }
  else {
    if ((uint)precision < 0x12) {
      uVar12 = (ulong)value & 0xfffffffffffff;
      if ((ulong)value >> 0x34 == 0) {
        lVar16 = 0x3f;
        if (uVar12 != 0) {
          for (; uVar12 >> lVar16 == 0; lVar16 = lVar16 + -1) {
          }
        }
        uVar12 = uVar12 << (~(byte)lVar16 + 0x35 & 0x3f);
        iVar10 = ((uint)lVar16 ^ 0xffffffc0) - 0x426;
      }
      else {
        uVar12 = uVar12 | 0x10000000000000;
        iVar10 = (uint)((ulong)value >> 0x34) - 0x433;
      }
      iVar24 = (int)((ulong)((long)(-0x32 - iVar10) * 0x4d104d42 + 0xffffffff) >> 0x20);
      uVar15 = iVar24 + 0x15b;
      uVar20 = iVar24 + 0x162;
      if (-1 < (int)uVar15) {
        uVar20 = uVar15;
      }
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uVar12 << 0xb;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = *(ulong *)(basic_data<void>::pow10_significands +
                               (long)((int)uVar20 >> 3) * 8 + 8);
      uVar23 = SUB168(auVar5 * auVar9,8) - (SUB168(auVar5 * auVar9,0) >> 0x3f);
      uVar21 = -(*(short *)(basic_data<void>::pow10_exponents + (long)((int)uVar20 >> 3) * 2 + 2) +
                iVar10) - 0x35;
      local_68 = (undefined1  [8])buf->ptr_;
      handler.buf._0_4_ = 0;
      bVar14 = (byte)uVar21;
      uVar17 = 1L << (bVar14 & 0x3f);
      handler.precision._0_1_ = uVar25 == 0x200000000;
      handler.size = 0x154 - (uVar20 & 0xfffffff8);
      uVar12 = uVar23 >> (bVar14 & 0x3f);
      uVar15 = (uint)uVar12;
      handler.buf._4_4_ = precision;
      if (uVar15 == 0) goto LAB_00231022;
      if (uVar12 >> 0x20 != 0) {
        assert_fail("/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/fmt/include/fmt/format-inl.h"
                    ,0x335,"");
      }
      local_34[0] = 1;
      if ((((9 < uVar15) && (local_34[0] = 2, 99 < uVar15)) && (local_34[0] = 3, 999 < uVar15)) &&
         (((local_34[0] = 4, 9999 < uVar15 && (local_34[0] = 5, 99999 < uVar15)) &&
          ((local_34[0] = 6, 999999 < uVar15 &&
           ((local_34[0] = 7, 9999999 < uVar15 && (local_34[0] = 8, 99999999 < uVar15)))))))) {
        local_34[0] = 10 - (uVar15 < 1000000000);
      }
      local_70 = value;
      rVar11 = fixed_handler::on_start
                         ((fixed_handler *)local_68,
                          (&basic_data<void>::powers_of_10_64)[local_34[0] - 1] << (bVar14 & 0x3f),
                          uVar23 / 10,10,(int *)local_34);
      if (rVar11 == more) {
        handler._16_8_ = uVar17 - 1;
        uVar23 = uVar23 & handler._16_8_;
        do {
          uVar15 = local_34[0] - 1;
          switch((ulong)uVar15) {
          case 0:
            cVar18 = (char)uVar12;
            uVar12 = 0;
            goto LAB_00230e6e;
          case 1:
            cVar18 = (char)((uVar12 & 0xffffffff) / 10);
            iVar10 = (int)((uVar12 & 0xffffffff) / 10) * 10;
            break;
          case 2:
            cVar18 = (char)((uVar12 & 0xffffffff) / 100);
            iVar10 = (int)((uVar12 & 0xffffffff) / 100) * 100;
            break;
          case 3:
            cVar18 = (char)((uVar12 & 0xffffffff) / 1000);
            iVar10 = (int)((uVar12 & 0xffffffff) / 1000) * 1000;
            break;
          case 4:
            cVar18 = (char)((uVar12 & 0xffffffff) / 10000);
            iVar10 = (int)((uVar12 & 0xffffffff) / 10000) * 10000;
            break;
          case 5:
            uVar19 = uVar12 >> 5 & 0x7ffffff;
            cVar18 = (char)(uVar19 / 0xc35);
            iVar10 = (int)(uVar19 / 0xc35) * 100000;
            break;
          case 6:
            cVar18 = (char)((uVar12 & 0xffffffff) / 1000000);
            iVar10 = (int)((uVar12 & 0xffffffff) / 1000000) * 1000000;
            break;
          case 7:
            cVar18 = (char)((uVar12 & 0xffffffff) / 10000000);
            iVar10 = (int)((uVar12 & 0xffffffff) / 10000000) * 10000000;
            break;
          case 8:
            cVar18 = (char)((uVar12 & 0xffffffff) / 100000000);
            iVar10 = (int)((uVar12 & 0xffffffff) / 100000000) * 100000000;
            break;
          case 9:
            uVar19 = (uVar12 >> 9 & 0x7fffff) * 0x44b83;
            cVar18 = (char)(uVar19 >> 0x27);
            iVar10 = (uint)(uVar19 >> 0x27) * 1000000000;
            break;
          default:
switchD_00230d96_default:
            assert_fail("/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/fmt/include/fmt/format-inl.h"
                        ,0x367,"invalid number of digits");
          }
          uVar12 = (ulong)(uint)((int)uVar12 - iVar10);
LAB_00230e6e:
          local_34[0] = uVar15;
          rVar11 = fixed_handler::on_digit
                             ((fixed_handler *)local_68,cVar18 + '0',
                              (&basic_data<void>::powers_of_10_64)[uVar15] << (bVar14 & 0x3f),
                              (uVar12 << (bVar14 & 0x3f)) + uVar23,1,uVar15,true);
          if (rVar11 != more) goto LAB_00230f16;
        } while (0 < (int)local_34[0]);
        error = 1;
        local_78 = (ulong)uVar21;
        do {
          uVar12 = uVar23 * 10;
          error = error * 10;
          uVar23 = uVar12 & handler._16_8_;
          local_34[0] = local_34[0] - 1;
          rVar11 = fixed_handler::on_digit
                             ((fixed_handler *)local_68,
                              (char)(uVar12 >> ((byte)local_78 & 0x3f)) + '0',uVar17,uVar23,error,
                              local_34[0],false);
        } while (rVar11 == more);
      }
LAB_00230f16:
      value = local_70;
      if (rVar11 != error) {
        uVar12 = (ulong)(uint)handler.buf;
        if ((int)(uint)handler.buf < 1 || uVar25 == 0x200000000) {
          if ((int)(uint)handler.buf < 0) goto LAB_00230f62;
        }
        else {
          uVar12 = (ulong)(uint)handler.buf;
          do {
            uVar15 = local_34[0] + 1;
            if (buf->ptr_[uVar12 - 1] != '0') goto LAB_00230fa5;
            bVar1 = 1 < uVar12;
            uVar12 = uVar12 - 1;
            local_34[0] = uVar15;
          } while (bVar1);
          uVar12 = 0;
        }
LAB_00230fa5:
        uVar12 = uVar12 & 0xffffffff;
        uVar25 = buf->capacity_;
        if (uVar25 < uVar12) {
          (**buf->_vptr_buffer)(buf,uVar12);
          uVar25 = buf->capacity_;
        }
        iVar24 = (uVar20 & 0xfffffff8) + 8;
        if (uVar25 < uVar12) {
          uVar12 = uVar25;
        }
        buf->size_ = uVar12;
        goto LAB_00230fd2;
      }
    }
    iVar10 = snprintf_float<double>(value,precision,specs,buf);
  }
  return iVar10;
}

Assistant:

int format_float(T value, int precision, float_specs specs, buffer<char>& buf) {
  static_assert(!std::is_same<T, float>::value, "");
  FMT_ASSERT(value >= 0, "value is negative");

  const bool fixed = specs.format == float_format::fixed;
  if (value <= 0) {  // <= instead of == to silence a warning.
    if (precision <= 0 || !fixed) {
      buf.push_back('0');
      return 0;
    }
    buf.try_resize(to_unsigned(precision));
    std::uninitialized_fill_n(buf.data(), precision, '0');
    return -precision;
  }

  if (!specs.use_grisu) return snprintf_float(value, precision, specs, buf);

  int exp = 0;
  const int min_exp = -60;  // alpha in Grisu.
  int cached_exp10 = 0;     // K in Grisu.
  if (precision < 0) {
    fp fp_value;
    auto boundaries = specs.binary32
                          ? fp_value.assign_float_with_boundaries(value)
                          : fp_value.assign_with_boundaries(value);
    fp_value = normalize(fp_value);
    // Find a cached power of 10 such that multiplying value by it will bring
    // the exponent in the range [min_exp, -32].
    const fp cached_pow = get_cached_power(
        min_exp - (fp_value.e + fp::significand_size), cached_exp10);
    // Multiply value and boundaries by the cached power of 10.
    fp_value = fp_value * cached_pow;
    boundaries.lower = multiply(boundaries.lower, cached_pow.f);
    boundaries.upper = multiply(boundaries.upper, cached_pow.f);
    assert(min_exp <= fp_value.e && fp_value.e <= -32);
    --boundaries.lower;  // \tilde{M}^- - 1 ulp -> M^-_{\downarrow}.
    ++boundaries.upper;  // \tilde{M}^+ + 1 ulp -> M^+_{\uparrow}.
    // Numbers outside of (lower, upper) definitely do not round to value.
    grisu_shortest_handler handler{buf.data(), 0,
                                   boundaries.upper - fp_value.f};
    auto result =
        grisu_gen_digits(fp(boundaries.upper, fp_value.e),
                         boundaries.upper - boundaries.lower, exp, handler);
    if (result == digits::error) {
      exp += handler.size - cached_exp10 - 1;
      fallback_format(value, buf, exp);
      return exp;
    }
    buf.try_resize(to_unsigned(handler.size));
  } else {
    if (precision > 17) return snprintf_float(value, precision, specs, buf);
    fp normalized = normalize(fp(value));
    const auto cached_pow = get_cached_power(
        min_exp - (normalized.e + fp::significand_size), cached_exp10);
    normalized = normalized * cached_pow;
    fixed_handler handler{buf.data(), 0, precision, -cached_exp10, fixed};
    if (grisu_gen_digits(normalized, 1, exp, handler) == digits::error)
      return snprintf_float(value, precision, specs, buf);
    int num_digits = handler.size;
    if (!fixed) {
      // Remove trailing zeros.
      while (num_digits > 0 && buf[num_digits - 1] == '0') {
        --num_digits;
        ++exp;
      }
    }
    buf.try_resize(to_unsigned(num_digits));
  }
  return exp - cached_exp10;
}